

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::HandleHeader
          (Disassembler *this,spv_endianness_t endian,uint32_t version,uint32_t generator,
          uint32_t id_bound,uint32_t schema)

{
  uint32_t schema_local;
  uint32_t id_bound_local;
  uint32_t generator_local;
  uint32_t version_local;
  spv_endianness_t endian_local;
  Disassembler *this_local;
  
  this->endian_ = endian;
  if ((this->header_ & 1U) != 0) {
    disassemble::InstructionDisassembler::EmitHeaderSpirv(&this->instruction_disassembler_);
    disassemble::InstructionDisassembler::EmitHeaderVersion
              (&this->instruction_disassembler_,version);
    disassemble::InstructionDisassembler::EmitHeaderGenerator
              (&this->instruction_disassembler_,generator);
    disassemble::InstructionDisassembler::EmitHeaderIdBound
              (&this->instruction_disassembler_,id_bound);
    disassemble::InstructionDisassembler::EmitHeaderSchema(&this->instruction_disassembler_,schema);
  }
  this->byte_offset_ = 0x14;
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Disassembler::HandleHeader(spv_endianness_t endian,
                                        uint32_t version, uint32_t generator,
                                        uint32_t id_bound, uint32_t schema) {
  endian_ = endian;

  if (header_) {
    instruction_disassembler_.EmitHeaderSpirv();
    instruction_disassembler_.EmitHeaderVersion(version);
    instruction_disassembler_.EmitHeaderGenerator(generator);
    instruction_disassembler_.EmitHeaderIdBound(id_bound);
    instruction_disassembler_.EmitHeaderSchema(schema);
  }

  byte_offset_ = SPV_INDEX_INSTRUCTION * sizeof(uint32_t);

  return SPV_SUCCESS;
}